

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::StandardPageSizesTestCase::iterate(StandardPageSizesTestCase *this)

{
  ostringstream *poVar1;
  _Rb_tree_color format;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var6;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint *pGVar7;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  StandardPageSizesTestCase *local_1c8;
  _Rb_tree_node_base *local_1c0;
  Functions *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture2");
  if (bVar4) {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_1b8 = (Functions *)CONCAT44(extraout_var,iVar5);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Testing getInternalformativ",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pGVar7 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pGVar7 != (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      local_1c0 = &(this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header.
                   _M_header;
      local_1c8 = this;
      do {
        p_Var6 = (local_1c8->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_left;
        if (p_Var6 != local_1c0) {
          do {
            format = p_Var6[1]._M_color;
            iVar5 = *(int *)&p_Var6[1].field_0x4;
            iVar2 = *(int *)&p_Var6[1]._M_parent;
            iVar3 = *(int *)((long)&p_Var6[1]._M_parent + 4);
            SparseTextureUtils::getTexturePageSizes
                      (local_1b8,*pGVar7,format,&local_1cc,&local_1d0,&local_1d4);
            if (((local_1cc != iVar5) || (local_1d0 != iVar2)) || (local_1d4 != iVar3)) {
              local_1b0._0_8_ =
                   ((local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Standard Virtual Page Size mismatch, target: ",0x2d);
              std::ostream::operator<<(poVar1,*pGVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", format: ",10);
              std::ostream::operator<<(poVar1,format);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", returned: ",0xc);
              std::ostream::operator<<(poVar1,local_1cc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
              std::ostream::operator<<(poVar1,local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
              std::ostream::operator<<(poVar1,local_1d4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", expected: ",0xc);
              std::ostream::operator<<(poVar1,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
              std::ostream::operator<<(poVar1,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
              std::ostream::operator<<(poVar1,iVar3);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              this_00 = (local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
              description = "Fail";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_00a6ed2e;
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          } while (p_Var6 != local_1c0);
        }
        pGVar7 = pGVar7 + 1;
        this = local_1c8;
      } while (pGVar7 != (local_1c8->mSupportedTargets).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00a6ed2e:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StandardPageSizesTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing getInternalformativ" << tcu::TestLog::EndMessage;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::map<glw::GLint, PageSizeStruct>::const_iterator formIter = mStandardVirtualPageSizesTable.begin();
			 formIter != mStandardVirtualPageSizesTable.end(); ++formIter)
		{
			const PageSizePair&   format = *formIter;
			const PageSizeStruct& page   = format.second;

			GLint pageSizeX;
			GLint pageSizeY;
			GLint pageSizeZ;
			SparseTextureUtils::getTexturePageSizes(gl, target, format.first, pageSizeX, pageSizeY, pageSizeZ);

			if (pageSizeX != page.xSize || pageSizeY != page.ySize || pageSizeZ != page.zSize)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Standard Virtual Page Size mismatch, target: " << target
								   << ", format: " << format.first << ", returned: " << pageSizeX << "/" << pageSizeY
								   << "/" << pageSizeZ << ", expected: " << page.xSize << "/" << page.ySize << "/"
								   << page.zSize << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}